

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkInformation.cxx
# Opt level: O2

void __thiscall
cmComputeLinkInformation::AddLibraryRuntimeInfo(cmComputeLinkInformation *this,string *fullPath)

{
  cmMakefile *this_00;
  bool bVar1;
  long lVar2;
  string file;
  string soname;
  allocator<char> local_b1;
  string local_b0;
  undefined1 local_90 [96];
  bool local_30;
  
  cmsys::SystemTools::GetFilenameName(&local_b0,fullPath);
  this_00 = this->Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_90,"CMAKE_PLATFORM_HAS_INSTALLNAME",&local_b1);
  bVar1 = cmMakefile::IsOn(this_00,(string *)local_90);
  std::__cxx11::string::~string((string *)local_90);
  if (bVar1) {
    local_90._0_8_ = local_90 + 0x10;
    local_90._8_8_ = 0;
    local_90[0x10] = '\0';
    bVar1 = cmSystemTools::GuessLibraryInstallName(fullPath,(string *)local_90);
    if (!bVar1) {
      std::__cxx11::string::~string((string *)local_90);
      goto LAB_002f2a45;
    }
    lVar2 = std::__cxx11::string::find((char *)local_90,0x5bfeb9);
    std::__cxx11::string::~string((string *)local_90);
    if (lVar2 == -1) goto LAB_002f2a45;
  }
  bVar1 = cmsys::RegularExpression::find(&this->ExtractSharedLibraryName,local_b0._M_dataplus._M_p);
  if (!bVar1) {
    if (this->ArchivesMayBeShared == true) {
      bVar1 = cmsys::RegularExpression::find
                        (&this->ExtractStaticLibraryName,local_b0._M_dataplus._M_p);
      if (bVar1) goto LAB_002f2a0d;
    }
    cmGlobalGenerator::SplitFrameworkPath
              ((optional<cmGlobalGenerator::FrameworkDescriptor> *)local_90,this->GlobalGenerator,
               fullPath,Strict);
    std::_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor>::_M_reset
              ((_Optional_payload_base<cmGlobalGenerator::FrameworkDescriptor> *)local_90);
    if (local_30 != true) goto LAB_002f2a45;
  }
LAB_002f2a0d:
  cmOrderDirectories::AddRuntimeLibrary
            ((this->OrderRuntimeSearchPath)._M_t.
             super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
             _M_t.
             super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>.
             super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,(char *)0x0);
  if (this->LinkWithRuntimePath == true) {
    cmOrderDirectories::AddRuntimeLibrary
              ((this->OrderLinkerSearchPath)._M_t.
               super___uniq_ptr_impl<cmOrderDirectories,_std::default_delete<cmOrderDirectories>_>.
               _M_t.
               super__Tuple_impl<0UL,_cmOrderDirectories_*,_std::default_delete<cmOrderDirectories>_>
               .super__Head_base<0UL,_cmOrderDirectories_*,_false>._M_head_impl,fullPath,(char *)0x0
              );
  }
LAB_002f2a45:
  std::__cxx11::string::~string((string *)&local_b0);
  return;
}

Assistant:

void cmComputeLinkInformation::AddLibraryRuntimeInfo(
  std::string const& fullPath)
{
  // Get the name of the library from the file name.
  bool is_shared_library = false;
  std::string file = cmSystemTools::GetFilenameName(fullPath);

  if (this->Makefile->IsOn("CMAKE_PLATFORM_HAS_INSTALLNAME")) {
    // Check that @rpath is part of the install name.
    // If it isn't, return.
    std::string soname;
    if (!cmSystemTools::GuessLibraryInstallName(fullPath, soname)) {
      return;
    }

    if (soname.find("@rpath") == std::string::npos) {
      return;
    }
  }

  is_shared_library = this->ExtractSharedLibraryName.find(file);

  if (!is_shared_library) {
    // On some platforms (AIX) a shared library may look static.
    if (this->ArchivesMayBeShared) {
      if (this->ExtractStaticLibraryName.find(file)) {
        // This is the name of a shared library or archive.
        is_shared_library = true;
      }
    }
  }

  // It could be an Apple framework
  if (!is_shared_library) {
    is_shared_library =
      this->GlobalGenerator
        ->SplitFrameworkPath(fullPath,
                             cmGlobalGenerator::FrameworkFormat::Strict)
        .has_value();
  }

  if (!is_shared_library) {
    return;
  }

  // Include this library in the runtime path ordering.
  this->OrderRuntimeSearchPath->AddRuntimeLibrary(fullPath);
  if (this->LinkWithRuntimePath) {
    this->OrderLinkerSearchPath->AddRuntimeLibrary(fullPath);
  }
}